

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  ushort *puVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  byte *pbVar4;
  byte bVar5;
  BYTE BVar6;
  ulong uVar7;
  undefined8 uVar8;
  ushort uVar9;
  ushort uVar10;
  char cVar11;
  uint uVar12;
  BYTE *__src;
  BYTE *pBVar13;
  uint8_t *puVar14;
  ushort *puVar15;
  BYTE *pBVar16;
  uint uVar17;
  ulong uVar18;
  BYTE *pBVar19;
  BYTE *d;
  BYTE *pBVar20;
  int iVar21;
  BYTE *pBVar22;
  long lVar23;
  BYTE *pBVar24;
  BYTE *e;
  BYTE *s;
  ushort *puVar25;
  ushort *puVar26;
  ushort *puVar27;
  ulong uVar28;
  ulong uVar29;
  BYTE *local_a0;
  int local_98;
  int local_80;
  BYTE *local_38;
  
  uVar28 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar28 == 0) {
    uVar17 = LZ4_decompress_safe(source,dest,compressedSize,maxOutputSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (uint8_t *)dest) {
      if (uVar28 < 0xffff) {
        uVar7 = LZ4_streamDecode->table[1];
        if (uVar7 != 0) {
          puVar25 = (ushort *)0xffffffff;
          if (source != (char *)0x0) {
            puVar14 = (LZ4_streamDecode->internal_donotuse).externalDict + uVar7;
            if ((LZ4_streamDecode->internal_donotuse).externalDict == (uint8_t *)0x0) {
              puVar14 = (uint8_t *)0x0;
            }
            if (maxOutputSize == 0) {
              if (compressedSize == 1) {
                puVar25 = (ushort *)(ulong)-(uint)(*source != '\0');
              }
            }
            else if (compressedSize != 0) {
              __src = (BYTE *)(dest + -uVar28);
              puVar1 = (ushort *)(source + compressedSize);
              pBVar2 = (BYTE *)(dest + maxOutputSize);
              pBVar20 = (BYTE *)dest;
              puVar25 = (ushort *)source;
              if (maxOutputSize < 0x40) goto LAB_00119a00;
              puVar15 = (ushort *)((long)puVar1 - 0xf);
              puVar26 = (ushort *)source;
LAB_0011931b:
              bVar5 = (byte)*puVar26;
              uVar17 = (uint)bVar5;
              puVar27 = (ushort *)((long)puVar26 + 1);
              uVar28 = (ulong)(uint)(bVar5 >> 4);
              puVar25 = puVar27;
              if (bVar5 >> 4 == 0xf) {
                if (puVar27 < puVar15) {
                  uVar12 = 0;
                  do {
                    uVar9 = *puVar25;
                    puVar25 = (ushort *)((long)puVar25 + 1);
                    uVar12 = uVar12 + (byte)uVar9;
                  } while (puVar25 < puVar15 && (byte)uVar9 == 0xff);
                  uVar28 = (ulong)uVar12 + 0xf;
                }
                else {
                  uVar28 = 0xf;
                }
                pBVar13 = pBVar20 + uVar28;
                iVar21 = 5;
                if ((((puVar27 < puVar15) && (!CARRY8((ulong)pBVar20,uVar28))) &&
                    (!CARRY8((ulong)puVar25,uVar28))) &&
                   ((iVar21 = 6, local_a0 = pBVar13, pBVar13 <= pBVar2 + -0x20 &&
                    ((ushort *)((long)puVar25 + uVar28) <= puVar1 + -0x10)))) {
                  lVar23 = 0;
                  do {
                    uVar8 = *(undefined8 *)((byte *)((long)puVar25 + lVar23) + 8);
                    pBVar22 = pBVar20 + lVar23;
                    *(undefined8 *)pBVar22 = *(undefined8 *)((long)puVar25 + lVar23);
                    *(undefined8 *)(pBVar22 + 8) = uVar8;
                    pbVar4 = (byte *)((long)puVar25 + lVar23 + 0x10);
                    uVar8 = *(undefined8 *)(pbVar4 + 8);
                    *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)pbVar4;
                    *(undefined8 *)(pBVar22 + 0x18) = uVar8;
                    lVar23 = lVar23 + 0x20;
                  } while (pBVar22 + 0x20 < pBVar13);
                  iVar21 = 0;
                  puVar25 = (ushort *)((long)puVar25 + uVar28);
                  pBVar20 = pBVar13;
                }
                pBVar13 = pBVar20;
                if (iVar21 != 0) {
                  if (iVar21 != 5) {
                    if (iVar21 == 6) goto LAB_00119844;
                    goto LAB_00119710;
                  }
                  goto LAB_00119aaf;
                }
              }
              else {
                local_a0 = pBVar20 + uVar28;
                if ((ushort *)((long)puVar1 - 0x11U) < puVar27) goto LAB_00119844;
                uVar8 = *(undefined8 *)((long)puVar26 + 9);
                *(undefined8 *)pBVar20 = *(undefined8 *)puVar27;
                *(undefined8 *)(pBVar20 + 8) = uVar8;
                puVar25 = (ushort *)(uVar28 + (long)puVar27);
                pBVar13 = local_a0;
              }
              uVar9 = *puVar25;
              uVar29 = (ulong)uVar9;
              puVar25 = puVar25 + 1;
              pBVar22 = pBVar13 + -uVar29;
              uVar28 = (ulong)(bVar5 & 0xf);
              if (uVar28 == 0xf) {
                iVar21 = 5;
                if ((uVar7 < 0x10000) && (pBVar22 + uVar7 < __src)) {
                  uVar18 = 0xf;
                }
                else {
                  uVar17 = 0;
                  do {
                    uVar10 = *puVar25;
                    puVar25 = (ushort *)((long)puVar25 + 1);
                    uVar17 = uVar17 + (byte)uVar10;
                  } while ((byte)uVar10 == 0xff && puVar25 < puVar1 + -2);
                  uVar28 = (ulong)uVar17;
                  uVar18 = uVar28 + 0xf;
                  if ((puVar25 < puVar1 + -2) && (!CARRY8((ulong)pBVar13,uVar18))) {
                    uVar18 = uVar28 + 0x13;
                    iVar21 = 7;
                    if (pBVar13 + uVar28 + 0x13 < pBVar2 + -0x40) {
                      iVar21 = 0;
                    }
                  }
                }
                if (iVar21 != 0) {
                  if (iVar21 != 5) {
                    if (iVar21 == 7) goto LAB_001198e7;
                    goto LAB_00119710;
                  }
                  goto LAB_00119aaf;
                }
              }
              else {
                uVar18 = uVar28 + 4;
                if (pBVar2 + -0x40 <= pBVar13 + uVar28 + 4) goto LAB_001198e7;
                if ((__src <= pBVar22) && (7 < uVar9)) {
                  *(undefined8 *)pBVar13 = *(undefined8 *)pBVar22;
                  *(undefined8 *)(pBVar13 + 8) = *(undefined8 *)(pBVar22 + 8);
                  *(undefined2 *)(pBVar13 + 0x10) = *(undefined2 *)(pBVar22 + 0x10);
                  pBVar20 = pBVar13 + uVar28 + 4;
                  puVar26 = puVar25;
                  goto LAB_0011931b;
                }
              }
              if ((uVar7 < 0x10000) && (pBVar22 + uVar7 < __src)) goto LAB_00119aaf;
              pBVar3 = pBVar13 + uVar18;
              pBVar20 = pBVar3;
              puVar26 = puVar25;
              if (pBVar22 < __src) {
                if (pBVar2 + -5 < pBVar3) goto LAB_00119aaf;
                uVar29 = (long)__src - (long)pBVar22;
                uVar28 = uVar18 - uVar29;
                if (uVar18 < uVar29 || uVar28 == 0) {
                  memmove(pBVar13,puVar14 + -uVar29,uVar18);
                }
                else {
                  memcpy(pBVar13,puVar14 + -uVar29,uVar29);
                  pBVar20 = pBVar13 + uVar29;
                  if ((ulong)((long)pBVar20 - (long)__src) < uVar28) {
                    pBVar13 = __src;
                    if ((long)uVar29 < (long)uVar18) {
                      do {
                        *pBVar20 = *pBVar13;
                        pBVar20 = pBVar20 + 1;
                        pBVar13 = pBVar13 + 1;
                      } while (pBVar20 < pBVar3);
                    }
                  }
                  else {
                    memcpy(pBVar20,__src,uVar28);
                    pBVar20 = pBVar3;
                  }
                }
              }
              else {
                local_a0 = pBVar3;
                if (uVar9 < 0x10) {
                  LZ4_memcpy_using_offset(pBVar13,pBVar22,pBVar3,uVar29);
                }
                else {
                  do {
                    uVar8 = *(undefined8 *)(pBVar13 + -uVar29 + 8);
                    *(undefined8 *)pBVar13 = *(undefined8 *)(pBVar13 + -uVar29);
                    *(undefined8 *)(pBVar13 + 8) = uVar8;
                    uVar8 = *(undefined8 *)(pBVar13 + -uVar29 + 0x10 + 8);
                    *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)(pBVar13 + -uVar29 + 0x10);
                    *(undefined8 *)(pBVar13 + 0x18) = uVar8;
                    pBVar13 = pBVar13 + 0x20;
                  } while (pBVar13 < pBVar3);
                }
              }
              goto LAB_0011931b;
            }
          }
          goto LAB_00119710;
        }
        uVar17 = LZ4_decompress_safe_withSmallPrefix
                           (source,dest,compressedSize,maxOutputSize,uVar28);
      }
      else {
        uVar17 = LZ4_decompress_safe_withPrefix64k(source,dest,compressedSize,maxOutputSize);
      }
      puVar25 = (ushort *)(ulong)uVar17;
      goto LAB_00119710;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar28;
    puVar14 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -uVar28;
    (LZ4_streamDecode->internal_donotuse).externalDict = puVar14;
    uVar17 = LZ4_decompress_safe_forceExtDict
                       (source,dest,compressedSize,maxOutputSize,puVar14,uVar28);
  }
  if ((int)uVar17 < 1) {
    return uVar17;
  }
  LZ4_streamDecode->table[3] = (ulong)uVar17;
  (LZ4_streamDecode->internal_donotuse).prefixEnd = (uint8_t *)(dest + uVar17);
  return uVar17;
LAB_001198e7:
  if ((uVar7 < 0x10000) && (pBVar22 + uVar7 < __src)) goto LAB_00119aaf;
  pBVar3 = pBVar13 + uVar18;
  pBVar20 = pBVar3;
  if (pBVar22 < __src) {
    if (pBVar2 + -5 < pBVar3) goto LAB_00119aaf;
    uVar29 = (long)__src - (long)pBVar22;
    uVar28 = uVar18 - uVar29;
    if (uVar18 < uVar29 || uVar28 == 0) {
      memmove(pBVar13,puVar14 + -uVar29,uVar18);
    }
    else {
      memcpy(pBVar13,puVar14 + -uVar29,uVar29);
      pBVar20 = pBVar13 + uVar29;
      if ((ulong)((long)pBVar20 - (long)__src) < uVar28) {
        pBVar13 = __src;
        if ((long)uVar29 < (long)uVar18) {
          do {
            *pBVar20 = *pBVar13;
            pBVar20 = pBVar20 + 1;
            pBVar13 = pBVar13 + 1;
          } while (pBVar20 < pBVar3);
        }
      }
      else {
        memcpy(pBVar20,__src,uVar28);
        pBVar20 = pBVar3;
      }
    }
  }
  else {
    if ((uint)uVar29 < 8) {
      LZ4_decompress_safe_continue_cold_1();
      pBVar22 = local_38;
    }
    else {
      *(undefined8 *)pBVar13 = *(undefined8 *)pBVar22;
      pBVar22 = pBVar22 + 8;
    }
    pBVar16 = pBVar13 + 8;
    if (pBVar2 + -0xc < pBVar3) {
      iVar21 = 5;
      if (pBVar3 <= pBVar2 + -5) {
        pBVar13 = pBVar2 + -7;
        pBVar19 = pBVar22;
        pBVar24 = pBVar16;
        if (pBVar16 < pBVar13) {
          do {
            *(undefined8 *)pBVar24 = *(undefined8 *)pBVar19;
            pBVar24 = pBVar24 + 8;
            pBVar19 = pBVar19 + 8;
          } while (pBVar24 < pBVar13);
          pBVar22 = pBVar22 + ((long)pBVar13 - (long)pBVar16);
          pBVar16 = pBVar13;
        }
        iVar21 = 0;
        for (; pBVar16 < pBVar3; pBVar16 = pBVar16 + 1) {
          BVar6 = *pBVar22;
          pBVar22 = pBVar22 + 1;
          *pBVar16 = BVar6;
        }
      }
      if (iVar21 != 0) {
        if (iVar21 != 5) goto LAB_00119710;
        goto LAB_00119aaf;
      }
    }
    else {
      *(undefined8 *)pBVar16 = *(undefined8 *)pBVar22;
      if (0x10 < uVar18) {
        pBVar13 = pBVar13 + 0x10;
        do {
          pBVar22 = pBVar22 + 8;
          *(undefined8 *)pBVar13 = *(undefined8 *)pBVar22;
          pBVar13 = pBVar13 + 8;
        } while (pBVar13 < pBVar3);
      }
    }
  }
LAB_00119a00:
  bVar5 = (byte)*puVar25;
  puVar15 = (ushort *)((long)puVar25 + 1);
  while( true ) {
    uVar17 = (uint)bVar5;
    if (bVar5 >> 4 == 0xf) break;
    uVar28 = (ulong)(uint)(bVar5 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar15) ||
       (dest + (long)maxOutputSize + -0x20 < pBVar20)) goto LAB_0011983d;
    uVar8 = *(undefined8 *)(puVar15 + 4);
    *(undefined8 *)pBVar20 = *(undefined8 *)puVar15;
    *(undefined8 *)(pBVar20 + 8) = uVar8;
    local_a0 = pBVar20 + uVar28;
    uVar18 = (ulong)(uVar17 & 0xf);
    puVar26 = (ushort *)((long)puVar15 + uVar28);
    uVar29 = (ulong)*puVar26;
    pBVar22 = local_a0 + -uVar29;
    if ((((uVar17 & 0xf) == 0xf) || (*puVar26 < 8)) || (pBVar22 < __src)) goto LAB_0011988e;
    *(undefined8 *)local_a0 = *(undefined8 *)pBVar22;
    *(undefined8 *)(local_a0 + 8) = *(undefined8 *)(pBVar22 + 8);
    *(undefined2 *)(local_a0 + 0x10) = *(undefined2 *)(pBVar22 + 0x10);
    pBVar20 = local_a0 + uVar18 + 4;
    bVar5 = *(byte *)((long)puVar15 + uVar28 + 2);
    puVar15 = (ushort *)((long)puVar15 + uVar28 + 3);
  }
  puVar26 = (ushort *)((long)puVar1 - 0xf);
  uVar28 = 0xf;
  puVar25 = puVar15;
  if (puVar15 < puVar26) {
    uVar12 = 0;
    do {
      uVar9 = *puVar25;
      puVar25 = (ushort *)((long)puVar25 + 1);
      uVar12 = uVar12 + (byte)uVar9;
    } while (puVar25 < puVar26 && (byte)uVar9 == 0xff);
    uVar28 = (ulong)uVar12 + 0xf;
  }
  if (((puVar26 <= puVar15) || (CARRY8((ulong)pBVar20,uVar28))) ||
     (puVar15 = puVar25, CARRY8((ulong)puVar25,uVar28))) goto LAB_00119aaf;
LAB_0011983d:
  local_a0 = pBVar20 + uVar28;
  puVar25 = puVar15;
LAB_00119844:
  puVar26 = (ushort *)(uVar28 + (long)puVar25);
  if ((pBVar2 + -0xc < local_a0) || (puVar1 + -4 < puVar26)) {
    if ((puVar26 != puVar1) || (pBVar2 < local_a0)) goto LAB_00119aaf;
    memmove(pBVar20,puVar25,uVar28);
    local_80 = (int)dest;
    puVar25 = (ushort *)(ulong)(uint)(((int)pBVar20 + (int)uVar28) - local_80);
    goto LAB_00119710;
  }
  do {
    *(undefined8 *)pBVar20 = *(undefined8 *)puVar25;
    pBVar20 = pBVar20 + 8;
    puVar25 = puVar25 + 4;
  } while (pBVar20 < local_a0);
  uVar29 = (ulong)*puVar26;
  pBVar22 = local_a0 + -uVar29;
  uVar18 = (ulong)(uVar17 & 0xf);
LAB_0011988e:
  puVar25 = puVar26 + 1;
  if ((int)uVar18 == 0xf) {
    uVar17 = 0;
    do {
      uVar9 = *puVar25;
      puVar25 = (ushort *)((long)puVar25 + 1);
      uVar17 = uVar17 + (byte)uVar9;
    } while (puVar25 < puVar1 + -2 && (byte)uVar9 == 0xff);
    uVar18 = (ulong)uVar17 + 0xf;
    cVar11 = '\x05';
    if (puVar25 < puVar1 + -2) {
      cVar11 = CARRY8((ulong)local_a0,uVar18) * '\x05';
    }
    if (cVar11 != '\0') goto LAB_00119a2d;
  }
  uVar18 = uVar18 + 4;
  pBVar13 = local_a0;
  goto LAB_001198e7;
LAB_00119a2d:
  if (cVar11 == '\x05') {
LAB_00119aaf:
    local_98 = (int)source;
    puVar25 = (ushort *)(ulong)(~(uint)puVar25 + local_98);
  }
LAB_00119710:
  if (0 < (int)puVar25) {
    LZ4_streamDecode->table[3] = LZ4_streamDecode->table[3] + ((ulong)puVar25 & 0xffffffff);
    (LZ4_streamDecode->internal_donotuse).prefixEnd =
         (LZ4_streamDecode->internal_donotuse).prefixEnd + ((ulong)puVar25 & 0xffffffff);
  }
  return (int)puVar25;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;

    if (lz4sd->prefixSize == 0) {
        /* The first call, no dictionary yet. */
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd = (BYTE*)dest + result;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        /* They're rolling the current segment. */
        if (lz4sd->prefixSize >= 64 KB - 1)
            result = LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        else if (lz4sd->extDictSize == 0)
            result = LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize,
                                                         lz4sd->prefixSize);
        else
            result = LZ4_decompress_safe_doubleDict(source, dest, compressedSize, maxOutputSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)result;
        lz4sd->prefixEnd  += result;
    } else {
        /* The buffer wraps around, or they're switching to another buffer. */
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize,
                                                  lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}